

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

size_t STRING_length(STRING_HANDLE handle)

{
  STRING *value;
  size_t result;
  STRING_HANDLE handle_local;
  
  value = (STRING *)0x0;
  if (handle != (STRING_HANDLE)0x0) {
    value = (STRING *)strlen(handle->s);
  }
  return (size_t)value;
}

Assistant:

size_t STRING_length(STRING_HANDLE handle)
{
    size_t result = 0;
    /* Codes_SRS_STRING_07_025: [STRING_length shall return zero if the given handle is NULL.] */
    if (handle != NULL)
    {
        STRING* value = (STRING*)handle;
        result = strlen(value->s);
    }
    return result;
}